

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_func_get_args(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  VmFrame *pVVar1;
  jx9_vm *pjVar2;
  void *pvVar3;
  jx9_value *pValue;
  uint *puVar4;
  ulong uVar5;
  
  pVVar1 = pCtx->pVm->pFrame;
  if (pVVar1->pParent == (VmFrame *)0x0) {
    jx9_context_throw_error(pCtx,2,"Called in the global scope");
  }
  else {
    pValue = jx9_context_new_array(pCtx);
    if (pValue != (jx9_value *)0x0) {
      puVar4 = (uint *)(pVVar1->sArg).pBase;
      for (uVar5 = 0; uVar5 < (pVVar1->sArg).nUsed; uVar5 = uVar5 + 1) {
        pjVar2 = pCtx->pVm;
        if ((*puVar4 < (pjVar2->aMemObj).nUsed) &&
           (pvVar3 = (pjVar2->aMemObj).pBase, pvVar3 != (void *)0x0)) {
          jx9_array_add_elem(pValue,(jx9_value *)0x0,
                             (jx9_value *)
                             ((long)pvVar3 + (ulong)(*puVar4 * (pjVar2->aMemObj).eSize)));
        }
        puVar4 = puVar4 + 4;
      }
      jx9_result_value(pCtx,pValue);
      return 0;
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int vm_builtin_func_get_args(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pObj = 0;
	jx9_value *pArray;
	VmFrame *pFrame;
	VmSlot *aSlot;
	sxu32 n;
	/* Point to the current frame */
	pFrame = pCtx->pVm->pFrame;
	if( pFrame->pParent == 0 ){
		/* Global frame, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Called in the global scope");
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Start filling the array with the given arguments */
	aSlot = (VmSlot *)SySetBasePtr(&pFrame->sArg);
	for( n = 0;  n < SySetUsed(&pFrame->sArg) ; n++ ){
		pObj = (jx9_value *)SySetAt(&pCtx->pVm->aMemObj, aSlot[n].nIdx);
		if( pObj ){
			jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pObj);
		}
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}